

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O2

real __thiscall
fasttext::HierarchicalSoftmaxLoss::forward
          (HierarchicalSoftmaxLoss *this,vector<int,_std::allocator<int>_> *targets,
          int32_t targetIndex,State *state,real lr,bool backprop)

{
  int iVar1;
  int32_t target;
  pointer pvVar2;
  long lVar3;
  const_reference labelIsPositive;
  pointer pvVar4;
  int32_t i;
  ulong __n;
  float fVar5;
  real rVar6;
  
  fVar5 = 0.0;
  __n = 0;
  iVar1 = (targets->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[targetIndex];
  pvVar2 = (this->codes_).
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (this->paths_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + iVar1;
  while( true ) {
    lVar3 = *(long *)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data;
    if ((ulong)((long)*(pointer *)
                       ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data + 8) - lVar3 >> 2) <= __n) break;
    target = *(int32_t *)(lVar3 + __n * 4);
    labelIsPositive = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar2 + iVar1,__n);
    rVar6 = BinaryLogisticLoss::binaryLogistic
                      (&this->super_BinaryLogisticLoss,target,state,labelIsPositive,lr,backprop);
    __n = __n + 1;
    fVar5 = fVar5 + rVar6;
  }
  return fVar5;
}

Assistant:

real HierarchicalSoftmaxLoss::forward(
    const std::vector<int32_t>& targets,
    int32_t targetIndex,
    Model::State& state,
    real lr,
    bool backprop) {
  real loss = 0.0;
  int32_t target = targets[targetIndex];
  const std::vector<bool>& binaryCode = codes_[target];
  const std::vector<int32_t>& pathToRoot = paths_[target];
  for (int32_t i = 0; i < pathToRoot.size(); i++) {
    loss += binaryLogistic(pathToRoot[i], state, binaryCode[i], lr, backprop);
  }
  return loss;
}